

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

int sorter_check_invariant(sorter_tim_sort_run_t *stack,int stack_curr)

{
  size_t B1;
  size_t A1;
  size_t C;
  size_t B;
  size_t A;
  int stack_curr_local;
  sorter_tim_sort_run_t *stack_local;
  int local_4;
  
  if (stack_curr < 2) {
    local_4 = 1;
  }
  else if (stack_curr == 2) {
    if (stack[1].length < stack->length) {
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  else if ((stack[stack_curr + -2].length + stack[stack_curr + -1].length <
            stack[stack_curr + -3].length) &&
          (stack[stack_curr + -1].length < stack[stack_curr + -2].length)) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int CHECK_INVARIANT(TIM_SORT_RUN_T *stack, const int stack_curr) {
  size_t A, B, C;

  if (stack_curr < 2) {
    return 1;
  }

  if (stack_curr == 2) {
    const size_t A1 = stack[stack_curr - 2].length;
    const size_t B1 = stack[stack_curr - 1].length;

    if (A1 <= B1) {
      return 0;
    }

    return 1;
  }

  A = stack[stack_curr - 3].length;
  B = stack[stack_curr - 2].length;
  C = stack[stack_curr - 1].length;

  if ((A <= B + C) || (B <= C)) {
    return 0;
  }

  return 1;
}